

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Piece.h
# Opt level: O2

optional<libchess::Piece> libchess::Piece::from(char c)

{
  int iVar1;
  optional<libchess::PieceType> oVar2;
  optional<libchess::Piece> oVar3;
  
  oVar2 = PieceType::from(c);
  if (((ulong)oVar2.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
              super__Optional_payload_base<libchess::PieceType> >> 0x20 & 1) == 0) {
    return (_Optional_base<libchess::Piece,_true,_true>)
           (_Optional_payload<libchess::Piece,_true,_true,_true>)0x0;
  }
  iVar1 = isupper((int)c);
  oVar3 = from((optional<libchess::PieceType>)
               ((ulong)oVar2.super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
                       super__Optional_payload_base<libchess::PieceType> & 0x1ffffffff),
               (optional<libchess::Color>)((ulong)(iVar1 == 0) | 0x100000000));
  return (optional<libchess::Piece>)
         oVar3.super__Optional_base<libchess::Piece,_true,_true>._M_payload.
         super__Optional_payload_base<libchess::Piece>;
}

Assistant:

constexpr static std::optional<Piece> from(char c) {
        auto piece_type = PieceType::from(c);
        if (!piece_type) {
            return {};
        }

        Color piece_color = std::isupper(c) ? constants::WHITE : constants::BLACK;
        return Piece::from(*piece_type, piece_color);
    }